

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_simul.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint64_t *puVar1;
  char cVar2;
  ulong *puVar3;
  uint64_t *t;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  int *piVar7;
  ulong uVar8;
  FILE *pFVar9;
  char *__s1;
  undefined8 uVar10;
  char **ppcVar11;
  long lVar12;
  os_thread_t *poVar13;
  char *pcVar14;
  uint64_t x;
  ulonglong uVar15;
  ulong uVar16;
  long lVar17;
  char **ppcVar18;
  char ***pppcVar19;
  void *arg;
  param_t *p;
  param_t *ppVar20;
  uint64_t *puVar21;
  size_t sStack_20070;
  undefined1 auStack_20068 [8];
  os_thread_t th [4096];
  rng_t rng;
  void *local_38;
  uint64_t ndummies;
  
  pcVar5 = argv[1];
  if (pcVar5 != (char *)0x0) {
    ppcVar11 = argv + 1;
    dir = pcVar5;
    pcVar14 = latency_file;
    if ((*pcVar5 == '.') ||
       (pcVar5 = strchr(pcVar5,0x2f), pcVar14 = latency_file, pcVar5 != (char *)0x0)) {
LAB_00103611:
      while (latency_file = pcVar14, pcVar5 = ppcVar11[1], pcVar5 != (char *)0x0) {
        pcVar6 = strchr(pcVar5,0x3d);
        if (pcVar6 == (char *)0x0) {
          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                  ,0xdc,"parse_param_arg");
          pcVar14 = "params need to be var=value, got \"%s\"";
          goto LAB_00103e36;
        }
        if (pcVar6[1] == '\0') {
          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                  ,0xdf,"parse_param_arg");
          pcVar14 = "empty value in \"%s\"";
          goto LAB_00103e36;
        }
        ppcVar11 = ppcVar11 + 1;
        pcVar14 = pcVar6 + 1;
        pppcVar19 = &params[0].enums;
        while( true ) {
          __s1 = ((param_t *)(pppcVar19 + -4))->name;
          if (__s1 == (char *)0x0) {
            fprintf(_stderr,"Unknown parameter \"%s\"; valid ones:",pcVar5);
            for (ppVar20 = params; ppVar20->name != (char *)0x0; ppVar20 = ppVar20 + 1) {
              fprintf(_stderr," %s");
            }
            goto LAB_00103b2f;
          }
          iVar4 = strncmp(__s1,pcVar5,(long)pcVar6 - (long)pcVar5);
          if ((iVar4 == 0) && (__s1[(long)pcVar6 - (long)pcVar5] == '\0')) break;
          pppcVar19 = pppcVar19 + 5;
        }
        puVar21 = (uint64_t *)pppcVar19[-3];
        if (puVar21 == (uint64_t *)0x0) goto LAB_001036bc;
        ppcVar18 = *pppcVar19;
        if (ppcVar18 != (char **)0x0) {
          uVar15 = 0;
          do {
            if (ppcVar18[uVar15] == (char *)0x0) {
              fprintf(_stderr,"Unknown value of %s; valid ones:",__s1);
              for (; *ppcVar18 != (char *)0x0; ppcVar18 = ppcVar18 + 1) {
                fprintf(_stderr," %s");
              }
LAB_00103b2f:
              fputc(10,_stderr);
              exit(1);
            }
            iVar4 = strcasecmp(pcVar14,ppcVar18[uVar15]);
            if (iVar4 == 0) goto LAB_001037b5;
            uVar15 = uVar15 + 1;
          } while( true );
        }
        piVar7 = __errno_location();
        *piVar7 = 0;
        uVar15 = strtoull(pcVar14,(char **)auStack_20068,0);
        if (*piVar7 != 0) {
          uVar10 = 0xa4;
LAB_00103fbc:
          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                  ,uVar10,"parse_uint_param");
          pcVar5 = "invalid value for %s: \"%s\"";
          pFVar9 = _stderr;
          goto LAB_00103fd3;
        }
        cVar2 = *(char *)auStack_20068;
        if (cVar2 != '\0') {
          if (cVar2 == 'G') {
            if ((*(char *)((long)auStack_20068 + 1) != '\0') &&
               ((*(char *)((long)auStack_20068 + 1) != 'B' ||
                (*(char *)((long)auStack_20068 + 2) != '\0')))) goto LAB_00103f98;
            uVar15 = uVar15 << 0x1e;
          }
          else if (cVar2 == 'T') {
            if ((*(char *)((long)auStack_20068 + 1) != '\0') &&
               ((*(char *)((long)auStack_20068 + 1) != 'B' ||
                (*(char *)((long)auStack_20068 + 2) != '\0')))) goto LAB_00103f98;
            uVar15 = uVar15 << 0x28;
          }
          else if (cVar2 == 'M') {
            if ((*(char *)((long)auStack_20068 + 1) != '\0') &&
               ((*(char *)((long)auStack_20068 + 1) != 'B' ||
                (*(char *)((long)auStack_20068 + 2) != '\0')))) goto LAB_00103f98;
            uVar15 = uVar15 << 0x14;
          }
          else {
            if ((cVar2 != 'K') ||
               ((*(char *)((long)auStack_20068 + 1) != '\0' &&
                ((*(char *)((long)auStack_20068 + 1) != 'B' ||
                 (*(char *)((long)auStack_20068 + 2) != '\0')))))) {
LAB_00103f98:
              uVar10 = 0xb1;
              goto LAB_00103fbc;
            }
            uVar15 = uVar15 << 10;
          }
        }
LAB_001037b5:
        uVar8 = (ulong)pppcVar19[-2];
        if (uVar15 < uVar8) {
          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                  ,0xf3,"parse_param_arg");
          fprintf(_stderr,"value for %s too small: wanted %lu..%lu, got %lu",__s1,uVar8,
                  pppcVar19[-1],uVar15);
          goto LAB_00104022;
        }
        uVar16 = (ulong)pppcVar19[-1];
        if (uVar16 < uVar15) {
          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                  ,0xf9,"parse_param_arg");
          fprintf(_stderr,"value for %s too big: wanted %lu..%lu, got %lu",__s1,uVar8,uVar16,uVar15)
          ;
          goto LAB_00104022;
        }
        *puVar21 = uVar15;
        pcVar14 = latency_file;
      }
      if (n_threads == 0) {
        uVar8 = sysconf(0x54);
        uVar8 = uVar8 & 0xffffffff;
        n_threads = 0x1000;
        if (uVar8 < 0x1000) {
          n_threads = uVar8;
        }
        if (uVar8 == 0) {
          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                  ,0x2ac,"main");
          pcVar5 = "can\'t obtain number of processor cores";
          goto LAB_00104014;
        }
      }
      if (max_size < min_size) {
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                ,0x2b0,"main");
        pcVar5 = "min_size > max_size";
        goto LAB_00103f6b;
      }
      printf("Parameters:\n  %-20s : %s\n","dir",dir);
      for (ppVar20 = params; ppVar20->name != (char *)0x0; ppVar20 = ppVar20 + 1) {
        puVar3 = ppVar20->var;
        if (puVar3 != (ulong *)0x0) {
          printf("  %-20s : ");
          ppcVar11 = ppVar20->enums;
          pcVar5 = (char *)0xffffffffffffffff;
          if (ppcVar11 == (char **)0x0) {
            uVar8 = *puVar3;
            if (uVar8 == 0xffffffffffffffff) {
              printf(anon_var_dwarf_5b5);
            }
            else {
              piVar7 = (int *)&DAT_00105694;
              for (; (uVar8 != 0 && ((uVar8 & 0x3ff) == 0)); uVar8 = uVar8 >> 10) {
                piVar7 = piVar7 + 1;
              }
              printf("%lu%s",uVar8,&DAT_00105694 + *piVar7);
            }
          }
          else {
            do {
              pcVar14 = pcVar5 + 1;
              pcVar5 = pcVar5 + 1;
            } while (ppcVar11[(long)pcVar14] != (char *)0x0);
            pcVar14 = (char *)*puVar3;
            if (pcVar14 < pcVar5) {
              pcVar14 = ppcVar11[(long)pcVar14];
              pcVar5 = "%s";
            }
            else {
              pcVar5 = "enum out of range: %lu";
            }
            printf(pcVar5,pcVar14);
          }
          putchar(10);
        }
      }
      lotta_zeroes = mmap((void *)0x0,max_size,1,0x8022,-1,0);
      if (lotta_zeroes == (void *)0x0) {
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                ,0x2ca,"main");
        pFVar9 = _stderr;
        piVar7 = __errno_location();
        pcVar5 = strerror(*piVar7);
        pcVar14 = "couldn\'t grab a zero buffer: mmap failed: %s";
      }
      else {
        randomize_r((rng_t *)((long)th + 0x1fff8),seed);
        vsize_seed = rnd64_r((rng_t *)((long)th + 0x1fff8));
        os_cond_init(&ready.cond);
        os_mutex_init(&ready.mutex);
        ready.wanted = n_threads;
        cache = (VMEMcache *)vmemcache_new();
        vmemcache_set_size(cache,cache_size);
        vmemcache_set_extent_size(cache,cache_extent_size);
        vmemcache_set_eviction_policy(cache,(undefined4)repl_policy);
        iVar4 = vmemcache_add(cache,dir);
        if (iVar4 != 0) {
          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                  ,0x247,"run_bench");
          pFVar9 = _stderr;
          __s1 = (char *)vmemcache_errormsg();
          pcVar5 = "vmemcache_add: %s (%s)";
          pcVar14 = dir;
LAB_00103fd3:
          fprintf(pFVar9,pcVar5,__s1,pcVar14);
          goto LAB_00104022;
        }
        if (latency_samples != 0) {
          lVar12 = n_threads * ops_count;
          latencies = (uint64_t *)malloc(lVar12 * 8 + 8);
          if (latencies != (uint64_t *)0x0) {
            latencies[lVar12] = 0xffffffffffffffff;
            goto LAB_00103a72;
          }
          fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                  "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                  ,0x24d,"run_bench");
          pcVar5 = "can\'t malloc latency ledger";
          sStack_20070 = 0x1b;
          goto LAB_00104016;
        }
LAB_00103a72:
        if (junk_start != 0) {
          puts("Pre-filling the cache with junk...");
          memset(auStack_20068,0x21,0x100);
          vmemcache_callback_on_evict(cache,on_evict_cb,0);
          local_38 = (void *)0x0;
          while (cache_is_full == '\0') {
            local_38 = (void *)((long)local_38 + 1);
            vmemcache_put(cache,&local_38,8,auStack_20068,0x100);
          }
          vmemcache_callback_on_evict(cache,0,0);
        }
        vmemcache_bench_set(cache,0,type == 0);
        vmemcache_bench_set(cache,2,1);
        if (warm_up != 0) {
          vmemcache_bench_set(cache,3,1);
        }
        puts("Spawning threads...");
        poVar13 = (os_thread_t *)auStack_20068;
        arg = (void *)0x0;
        while (arg < n_threads) {
          iVar4 = os_thread_create(poVar13,(os_thread_attr_t *)0x0,worker,arg);
          arg = (void *)((long)arg + 1);
          poVar13 = poVar13 + 1;
          if (iVar4 != 0) {
            fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                    "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                    ,0x270,"run_bench");
            pFVar9 = _stderr;
            piVar7 = __errno_location();
            pcVar5 = strerror(*piVar7);
            pcVar14 = "thread creation failed: %s";
            goto LAB_00103e83;
          }
        }
        poVar13 = (os_thread_t *)auStack_20068;
        uVar8 = 0;
        for (uVar16 = 0; uVar16 < n_threads; uVar16 = uVar16 + 1) {
          iVar4 = os_thread_join(poVar13,&local_38);
          if (iVar4 != 0) {
            fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                    "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                    ,0x278,"run_bench");
            pFVar9 = _stderr;
            piVar7 = __errno_location();
            pcVar5 = strerror(*piVar7);
            pcVar14 = "thread join failed: %s";
            goto LAB_00103e83;
          }
          uVar8 = uVar8 + (long)local_38;
          poVar13 = poVar13 + 1;
        }
        puts("Done.");
        print_stats(cache);
        if (latencies == (uint64_t *)0x0) {
LAB_00103d4d:
          vmemcache_delete(cache);
          printf("Total time: %lu.%09lu s\n",uVar8 / 1000000000,uVar8 % 1000000000);
          uVar8 = (uVar8 / n_threads) / ops_count;
          printf(anon_var_dwarf_682,uVar8 / 1000,uVar8 % 1000);
          free(latencies);
          return 0;
        }
        pFVar9 = _stdout;
        if ((latency_file == (char *)0x0) ||
           (pFVar9 = fopen(latency_file,"w"), pFVar9 != (FILE *)0x0)) {
          qsort(latencies,ops_count * n_threads,8,cmp_u64);
          t = latencies;
          latencies[n_threads * ops_count] = 0xffffffffffffffff;
          puVar21 = t + -1;
          lVar12 = -8;
          do {
            lVar12 = lVar12 + 8;
            puVar1 = puVar21 + 1;
            puVar21 = puVar21 + 1;
          } while (-1 < (long)*puVar1);
          lVar17 = ops_count * n_threads;
          print_ntiles((FILE *)pFVar9,t,lVar12 >> 3);
          print_ntiles((FILE *)pFVar9,puVar21,lVar17 - (lVar12 >> 3));
          if (latency_file != (char *)0x0) {
            fclose(pFVar9);
          }
          goto LAB_00103d4d;
        }
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
                ,0x220,"dump_latencies");
        pFVar9 = _stderr;
        piVar7 = __errno_location();
        pcVar5 = strerror(*piVar7);
        pcVar14 = "can\'t create latency file: %s";
      }
LAB_00103e83:
      fprintf(pFVar9,pcVar14,pcVar5);
      goto LAB_00104022;
    }
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
            ,0x119,"parse_args");
    pcVar14 = "implausible dir -- prefix with ./ if you want %s";
    pcVar5 = dir;
LAB_00103e36:
    fprintf(_stderr,pcVar14,pcVar5);
    goto LAB_00104022;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
          ,0x10d,"parse_args");
  pcVar5 = "Usage: bench_simul dir [arg=val] [...]";
LAB_00104014:
  sStack_20070 = 0x26;
  goto LAB_00104016;
LAB_001036bc:
  iVar4 = strcmp(__s1,"latency_file");
  if (iVar4 != 0) goto LAB_00103f36;
  goto LAB_00103611;
LAB_00103f36:
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
          ,0xd0,"parse_other_param");
  pcVar5 = "unknown other_param";
LAB_00103f6b:
  sStack_20070 = 0x13;
LAB_00104016:
  fwrite(pcVar5,sStack_20070,1,_stderr);
LAB_00104022:
  fputc(10,_stderr);
  abort();
}

Assistant:

int
main(int argc, const char **argv)
{
	parse_args(argv + 1);

	if (!n_threads) {
		n_threads = (uint32_t)sysconf(_SC_NPROCESSORS_ONLN);
		if (n_threads > MAX_THREADS)
			n_threads = MAX_THREADS;
		if (!n_threads)
			UT_FATAL("can't obtain number of processor cores");
	}

	if (min_size > max_size)
		UT_FATAL("min_size > max_size");

	printf("Parameters:\n  %-20s : %s\n", "dir", dir);
	for (struct param_t *p = params; p->name; p++) {
		if (!p->var)
			continue;

		printf("  %-20s : ", p->name);
		if (p->enums) {
			uint64_t nvalid = 0;
			for (; p->enums[nvalid]; nvalid++)
				;

			if (*p->var < nvalid)
				printf("%s", p->enums[*p->var]);
			else
				printf("enum out of range: %lu", *p->var);
		} else
			print_units(*p->var);
		printf("\n");
	}

	lotta_zeroes = mmap(NULL, max_size, PROT_READ,
		MAP_PRIVATE | MAP_ANONYMOUS | MAP_POPULATE, -1, 0);
	if (!lotta_zeroes) {
		UT_FATAL("couldn't grab a zero buffer: mmap failed: %s",
			strerror(errno));
	}

	run_bench();

	return 0;
}